

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderConstantVariables.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderConstantVariables::iterate(GeometryShaderConstantVariables *this)

{
  ostringstream *poVar1;
  long lVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  long lVar6;
  MessageBuilder *pMVar7;
  char *description;
  bool bVar8;
  qpTestResult testResult;
  TestContext *this_00;
  undefined1 *value;
  long lVar9;
  GLint int_value;
  GLint n_max_geometry_uniform_components;
  GLint n_max_geometry_uniform_blocks;
  long local_1e0;
  GLint constant_values [9];
  GLint n_max_geometry_uniform_block_size;
  undefined1 local_1b0 [384];
  
  initTest(this);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar9 + 0xd8))(this->m_vao_id);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Could not bind a vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc0);
  (**(code **)(lVar9 + 0x40))(0x8892,this->m_bo_id);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Could not bind a buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc3);
  (**(code **)(lVar9 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Could not bind buffer object to transform feedback binding point.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc6);
  (**(code **)(lVar9 + 0x1680))(this->m_program_id);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xca);
  (**(code **)(lVar9 + 0x5e0))(0x8c89);
  (**(code **)(lVar9 + 0x30))(0);
  (**(code **)(lVar9 + 0x538))(0,0,1);
  (**(code **)(lVar9 + 0x638))();
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Rendering failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xd4);
  (**(code **)(lVar9 + 0x4e8))(0x8c89);
  constant_values[8] = 0;
  constant_values[4] = 0;
  constant_values[5] = 0;
  constant_values[6] = 0;
  constant_values[7] = 0;
  constant_values[0] = 0;
  constant_values[1] = 0;
  constant_values[2] = 0;
  constant_values[3] = 0;
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS,constant_values)
  ;
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xdf);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS,
             constant_values + 1);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xe3);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,
             constant_values + 2);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xe7);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,
             constant_values + 3);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xeb);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,
             constant_values + 4);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xef);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,
             constant_values + 5);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xf3);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS,
             constant_values + 6);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xf7);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,
             constant_values + 7);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xfb);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS,
             constant_values + 8);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xff);
  lVar6 = (**(code **)(lVar9 + 0xd00))(0x8c8e,0,0x24,1);
  local_1e0 = lVar9;
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Could not map buffer object storage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x104);
  value = m_feedbackVaryings;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  bVar8 = false;
  for (lVar9 = 0; lVar2 = local_1e0, lVar9 != 0x24; lVar9 = lVar9 + 4) {
    if (*(int *)((long)constant_values + lVar9) != *(int *)(lVar6 + lVar9)) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Values reported for ES constant ");
      pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)value);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " in a shader: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)(lVar6 + lVar9));
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " and via a glGetIntegerv() call: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)constant_values + lVar9));
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " do not match.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar8 = true;
    }
    value = (undefined1 *)((long)value + 8);
  }
  (**(code **)(local_1e0 + 0x1670))(0x8c8e);
  int_value = 0;
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,&int_value
            );
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x120);
  if (int_value < this->m_min_MaxGeometryAtomicCounterBuffers) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryAtomicCounterBuffers);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x12e);
  if (int_value < this->m_min_MaxGeometryAtomicCounters) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reported GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT constant value "
                   );
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryAtomicCounters);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x13c);
  if (int_value < this->m_min_MaxGeometryImagesUniforms) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reported GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT constant value ")
    ;
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryImagesUniforms);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x149);
  if (int_value < this->m_min_MaxGeometryTextureImagesUnits) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryTextureImagesUnits);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,&int_value)
  ;
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x158);
  if (int_value < this->m_min_MaxGeometryShaderStorageBlocks) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryShaderStorageBlocks);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x166);
  if (int_value < this->m_min_MaxGeometryUniformComponents) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryUniformComponents);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x174);
  if (int_value < this->m_min_MaxGeometryUniformBlocks) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reported GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT constant value ")
    ;
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryUniformBlocks);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x181);
  if (int_value < this->m_min_MaxGeometryInputComponents) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryInputComponents);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x18e);
  if (int_value < this->m_min_MaxGeometryOutputComponents) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryOutputComponents);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x19b);
  if (int_value < this->m_min_MaxGeometryOutputVertices) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reported GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT constant value "
                   );
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryOutputVertices);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,
             &int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1a8);
  if (int_value < this->m_min_MaxGeometryTotalOutputComponents) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryTotalOutputComponents);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_INVOCATIONS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1b6);
  if (int_value < this->m_min_MaxGeometryShaderInvocations) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxGeometryShaderInvocations);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar2 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_FRAMEBUFFER_LAYERS,&int_value);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_FRAMEBUFFER_LAYERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1c3);
  if (int_value < this->m_min_MaxFramebufferLayers) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reported GL_MAX_FRAMEBUFFER_LAYERS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_min_MaxFramebufferLayers);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  lVar9 = local_1e0;
  n_max_geometry_uniform_blocks = 0;
  n_max_geometry_uniform_block_size = 0;
  n_max_geometry_uniform_components = 0;
  (**(code **)(local_1e0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1d5);
  (**(code **)(lVar9 + 0x868))(0x8a30,&n_max_geometry_uniform_block_size);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_UNIFORM_BLOCK_SIZE.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1d9);
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,
             &n_max_geometry_uniform_components);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1dd);
  iVar3 = (n_max_geometry_uniform_block_size * n_max_geometry_uniform_blocks) / 4 +
          n_max_geometry_uniform_components;
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS,
             &int_value,
             (long)(n_max_geometry_uniform_block_size * n_max_geometry_uniform_blocks) % 4 &
             0xffffffff);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,
                  "glGetIntegerv() failed for GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1e5);
  if (int_value < iVar3) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Reported GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is smaller than required minimum value of ");
    std::ostream::operator<<(poVar1,iVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar8 = true;
  }
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.LAYER_PROVOKING_VERTEX,&int_value);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,500);
  uVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if (((((uVar5 & 0x300) == 0) || (int_value == 0x8e4f)) ||
      (int_value == (this->super_TestCaseBase).m_glExtTokens.FIRST_VERTEX_CONVENTION)) ||
     ((int_value == (this->super_TestCaseBase).m_glExtTokens.LAST_VERTEX_CONVENTION ||
      (int_value == (this->super_TestCaseBase).m_glExtTokens.UNDEFINED_VERTEX)))) {
    if (!bVar8) {
      this_00 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00cdea09;
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reported GL_LAYER_PROVOKING_VERTEX_EXT constant value ");
    std::ostream::operator<<(poVar1,int_value);
    std::operator<<((ostream *)poVar1," is not among permissible values");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  this_00 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00cdea09:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderConstantVariables::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up relevant bindings */
	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a vertex array object");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a buffer object!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object to transform feedback binding point.");

	/* Prepare for rendering. */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	gl.enable(GL_RASTERIZER_DISCARD);

	gl.beginTransformFeedback(GL_POINTS);
	{
		/* Render */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed.");

	gl.disable(GL_RASTERIZER_DISCARD);

	/* First, retrieve the ES constant values using the API. */
	const unsigned int n_varyings				   = sizeof(m_feedbackVaryings) / sizeof(m_feedbackVaryings[0]);
	glw::GLint		   constant_values[n_varyings] = { 0 };
	unsigned int	   index					   = 0;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT failed.");

	const glw::GLint* stored_data_ptr = (const glw::GLint*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(glw::GLint) * n_varyings, GL_MAP_READ_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer object storage");

	/* Compare the values that were stored by the draw call with values
	 * returned by the getter call.
	 */
	bool has_failed = false;
	for (unsigned int id = 0; id < n_varyings; ++id)
	{
		if (constant_values[id] != stored_data_ptr[id])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for ES constant " << m_feedbackVaryings[id]
							   << " in a shader: " << stored_data_ptr[id]
							   << " and via a glGetIntegerv() call: " << constant_values[id] << " do not match."
							   << tcu::TestLog::EndMessage;
			has_failed = true;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

	/* Check whether the reported values are at least of the minimum value described in relevant
	 * extension specifications */

	glw::GLint int_value = 0;

	/* Check values of ES constants specific to shader atomic counters */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT");

	if (int_value < m_min_MaxGeometryAtomicCounterBuffers)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryAtomicCounterBuffers
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT");

	if (int_value < m_min_MaxGeometryAtomicCounters)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryAtomicCounters << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check values of ES constants specific to image load store */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT");

	if (int_value < m_min_MaxGeometryImagesUniforms)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryImagesUniforms << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT");

	if (int_value < m_min_MaxGeometryTextureImagesUnits)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryTextureImagesUnits
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check values of ES constants specific to shader storage buffer objects */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT");

	if (int_value < m_min_MaxGeometryShaderStorageBlocks)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryShaderStorageBlocks
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryUniformComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryUniformComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check EXT_geometry_shader specific constant values */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT");

	if (int_value < m_min_MaxGeometryUniformBlocks)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryUniformBlocks << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryInputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryInputComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryOutputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryOutputComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT");

	if (int_value < m_min_MaxGeometryOutputVertices)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryOutputVertices << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryTotalOutputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryTotalOutputComponents
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_INVOCATIONS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT");

	if (int_value < m_min_MaxGeometryShaderInvocations)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryShaderInvocations << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_FRAMEBUFFER_LAYERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_FRAMEBUFFER_LAYERS_EXT");

	if (int_value < m_min_MaxFramebufferLayers)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_FRAMEBUFFER_LAYERS_EXT constant value "
						   << int_value << " is smaller than required minimum value of " << m_min_MaxFramebufferLayers
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Compute minimum value that is acceptable for gl_MaxCombinedGeometryUniformComponents */
	glw::GLint n_max_geometry_uniform_blocks	 = 0;
	glw::GLint n_max_geometry_uniform_block_size = 0;
	glw::GLint n_max_geometry_uniform_components = 0;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS, &n_max_geometry_uniform_blocks);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT.");

	gl.getIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &n_max_geometry_uniform_block_size);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_UNIFORM_BLOCK_SIZE.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &n_max_geometry_uniform_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT.");

	glw::GLint n_max_combined_geometry_uniform_components =
		n_max_geometry_uniform_blocks * n_max_geometry_uniform_block_size / 4 + n_max_geometry_uniform_components;

	/* Compare against actual constant value */
	gl.getIntegerv(m_glExtTokens.MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT.");

	if (int_value < n_max_combined_geometry_uniform_components)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value " << int_value
						   << " is smaller than required minimum value of "
						   << n_max_combined_geometry_uniform_components << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Make sure value reported for GL_LAYER_PROVOKING_VERTEX_EXT is valid */
	gl.getIntegerv(m_glExtTokens.LAYER_PROVOKING_VERTEX, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT.");

	if (
		/* This value is allowed in Desktop OpenGL, but not in the ES 3.1 extension. */
		(!glu::isContextTypeES(m_context.getRenderContext().getType()) &&
		 (glw::GLenum)int_value != GL_PROVOKING_VERTEX) &&
		(glw::GLenum)int_value != m_glExtTokens.FIRST_VERTEX_CONVENTION &&
		(glw::GLenum)int_value != m_glExtTokens.LAST_VERTEX_CONVENTION &&
		(glw::GLenum)int_value != m_glExtTokens.UNDEFINED_VERTEX)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_LAYER_PROVOKING_VERTEX_EXT constant value "
						   << int_value << " is not among permissible values" << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	if (has_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}